

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackExternalGenerator::InstallCMakeProject
          (cmCPackExternalGenerator *this,bool setDestDir,string *installDirectory,
          string *baseTempInstallDirectory,mode_t *default_dir_mode,string *component,
          bool componentInstall,string *installSubDirectory,string *buildConfig,
          string *absoluteDestFiles)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = StagingEnabled(this);
  if (bVar1) {
    iVar2 = cmCPackGenerator::InstallCMakeProject
                      (&this->super_cmCPackGenerator,setDestDir,installDirectory,
                       baseTempInstallDirectory,default_dir_mode,component,componentInstall,
                       installSubDirectory,buildConfig,absoluteDestFiles);
    return iVar2;
  }
  return 1;
}

Assistant:

int cmCPackExternalGenerator::InstallCMakeProject(
  bool setDestDir, const std::string& installDirectory,
  const std::string& baseTempInstallDirectory, const mode_t* default_dir_mode,
  const std::string& component, bool componentInstall,
  const std::string& installSubDirectory, const std::string& buildConfig,
  std::string& absoluteDestFiles)
{
  if (this->StagingEnabled()) {
    return this->cmCPackGenerator::InstallCMakeProject(
      setDestDir, installDirectory, baseTempInstallDirectory, default_dir_mode,
      component, componentInstall, installSubDirectory, buildConfig,
      absoluteDestFiles);
  }

  return 1;
}